

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  diff_match_patch_test dmp_test;
  diff_match_patch_test dStack_28;
  
  diff_match_patch::diff_match_patch(&dStack_28.dmp);
  ResetOutputStream();
  wprintf(L"Starting diff_match_patch unit tests.");
  wprintf(L"\n");
  diff_match_patch_test::run_all_tests(&dStack_28);
  ResetOutputStream();
  wprintf(L"Done.");
  wprintf(L"\n");
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  diff_match_patch_test dmp_test;
  dmpDebug(L"Starting diff_match_patch unit tests.");
  dmp_test.run_all_tests();
  dmpDebug(L"Done.");
  return 0;
}